

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::SerializeWithCachedSizes
          (Value_ImmediateValue *this,CodedOutputStream *output)

{
  if (this->_oneof_case_[0] == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->value_).tensor_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->value_).tensor_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->value_).tensor_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[0] == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->value_).tensor_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void Value_ImmediateValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue tensor = 1;
  if (has_tensor()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *value_.tensor_, output);
  }

  // .CoreML.Specification.MILSpec.TupleValue tuple = 2;
  if (has_tuple()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *value_.tuple_, output);
  }

  // .CoreML.Specification.MILSpec.ListValue list = 3;
  if (has_list()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *value_.list_, output);
  }

  // .CoreML.Specification.MILSpec.DictionaryValue dictionary = 4;
  if (has_dictionary()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *value_.dictionary_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.Value.ImmediateValue)
}